

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O0

int Pdr_ManSimDataInit(Aig_Man_t *pAig,Vec_Int_t *vCiObjs,Vec_Int_t *vCiVals,Vec_Int_t *vNodes,
                      Vec_Int_t *vCoObjs,Vec_Int_t *vCoVals,Vec_Int_t *vCi2Rem)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  int iVar4;
  int local_4c;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vCoVals_local;
  Vec_Int_t *vCoObjs_local;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vCiVals_local;
  Vec_Int_t *vCiObjs_local;
  Aig_Man_t *pAig_local;
  
  pAVar3 = Aig_ManConst1(pAig);
  Pdr_ManSimInfoSet(pAig,pAVar3,2);
  for (local_4c = 0; iVar1 = Vec_IntSize(vCiObjs), local_4c < iVar1; local_4c = local_4c + 1) {
    iVar1 = Vec_IntEntry(vCiObjs,local_4c);
    pAVar3 = Aig_ManObj(pAig,iVar1);
    iVar2 = Vec_IntEntry(vCiVals,local_4c);
    iVar1 = 1;
    if (iVar2 != 0) {
      iVar1 = 2;
    }
    Pdr_ManSimInfoSet(pAig,pAVar3,iVar1);
  }
  if (vCi2Rem != (Vec_Int_t *)0x0) {
    for (local_4c = 0; iVar1 = Vec_IntSize(vCi2Rem), local_4c < iVar1; local_4c = local_4c + 1) {
      iVar1 = Vec_IntEntry(vCi2Rem,local_4c);
      pAVar3 = Aig_ManObj(pAig,iVar1);
      Pdr_ManSimInfoSet(pAig,pAVar3,3);
    }
  }
  for (local_4c = 0; iVar1 = Vec_IntSize(vNodes), local_4c < iVar1; local_4c = local_4c + 1) {
    iVar1 = Vec_IntEntry(vNodes,local_4c);
    pAVar3 = Aig_ManObj(pAig,iVar1);
    Pdr_ManExtendOneEval(pAig,pAVar3);
  }
  for (local_4c = 0; iVar1 = Vec_IntSize(vCoObjs), local_4c < iVar1; local_4c = local_4c + 1) {
    iVar1 = Vec_IntEntry(vCoObjs,local_4c);
    pAVar3 = Aig_ManObj(pAig,iVar1);
    Pdr_ManExtendOneEval(pAig,pAVar3);
  }
  local_4c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vCoObjs);
    if (iVar1 <= local_4c) {
      return 1;
    }
    iVar1 = Vec_IntEntry(vCoObjs,local_4c);
    pAVar3 = Aig_ManObj(pAig,iVar1);
    iVar1 = Pdr_ManSimInfoGet(pAig,pAVar3);
    iVar2 = Vec_IntEntry(vCoVals,local_4c);
    iVar4 = 1;
    if (iVar2 != 0) {
      iVar4 = 2;
    }
    if (iVar1 != iVar4) break;
    local_4c = local_4c + 1;
  }
  return 0;
}

Assistant:

int Pdr_ManSimDataInit( Aig_Man_t * pAig,
    Vec_Int_t * vCiObjs, Vec_Int_t * vCiVals, Vec_Int_t * vNodes,
    Vec_Int_t * vCoObjs, Vec_Int_t * vCoVals, Vec_Int_t * vCi2Rem )
{
    Aig_Obj_t * pObj;
    int i;
    // set the CI values
    Pdr_ManSimInfoSet( pAig, Aig_ManConst1(pAig), PDR_ONE );
    Aig_ManForEachObjVec( vCiObjs, pAig, pObj, i )
        Pdr_ManSimInfoSet( pAig, pObj, (Vec_IntEntry(vCiVals, i)?PDR_ONE:PDR_ZER) );
    // set the FOs to remove
    if ( vCi2Rem != NULL )
    Aig_ManForEachObjVec( vCi2Rem, pAig, pObj, i )
        Pdr_ManSimInfoSet( pAig, pObj, PDR_UND );
    // perform ternary simulation
    Aig_ManForEachObjVec( vNodes, pAig, pObj, i )
        Pdr_ManExtendOneEval( pAig, pObj );
    // transfer results to the output
    Aig_ManForEachObjVec( vCoObjs, pAig, pObj, i )
        Pdr_ManExtendOneEval( pAig, pObj );
    // check the results
    Aig_ManForEachObjVec( vCoObjs, pAig, pObj, i )
        if ( Pdr_ManSimInfoGet( pAig, pObj ) != (Vec_IntEntry(vCoVals, i)?PDR_ONE:PDR_ZER) )
            return 0;
    return 1;
}